

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.h
# Opt level: O1

void llvm::yaml::ScalarEnumerationTraits<llvm::dwarf::UnitType,_void>::enumeration
               (IO *io,UnitType *value)

{
  int iVar1;
  
  iVar1 = (*io->_vptr_IO[2])();
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_UT_compile",(ulong)(*value == DW_UT_compile & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_UT_compile;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_UT_type",(ulong)(*value == DW_UT_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_UT_type;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_UT_partial",(ulong)(*value == DW_UT_partial & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_UT_partial;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])(io,"DW_UT_skeleton",(ulong)(*value == DW_UT_skeleton & (byte)iVar1))
  ;
  if ((char)iVar1 != '\0') {
    *value = DW_UT_skeleton;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_UT_split_compile",(ulong)(*value == DW_UT_split_compile & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_UT_split_compile;
  }
  iVar1 = (*io->_vptr_IO[2])(io);
  iVar1 = (*io->_vptr_IO[0x15])
                    (io,"DW_UT_split_type",(ulong)(*value == DW_UT_split_type & (byte)iVar1));
  if ((char)iVar1 != '\0') {
    *value = DW_UT_split_type;
  }
  IO::enumFallback<llvm::yaml::Hex8,llvm::dwarf::UnitType>(io,value);
  return;
}

Assistant:

static void enumeration(IO &io, dwarf::UnitType &value) {
#include "llvm/BinaryFormat/Dwarf.def"
    io.enumFallback<Hex8>(value);
  }